

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

string * __thiscall
gnuplotio::Gnuplot::
binaryFile<std::vector<signed_char,std::allocator<signed_char>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,Gnuplot *this,string *arg,string *filename,
          undefined8 arr_or_rec)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_418 [32];
  undefined1 local_3f8 [8];
  ostringstream cmdline;
  undefined1 local_268 [8];
  fstream tmp_stream;
  undefined1 local_258 [512];
  string local_58;
  undefined8 local_38;
  string *arr_or_rec_local;
  string *filename_local;
  vector<signed_char,_std::allocator<signed_char>_> *arg_local;
  Gnuplot *this_local;
  string *local_10;
  
  local_38 = arr_or_rec;
  arr_or_rec_local = filename;
  filename_local = arg;
  arg_local = (vector<signed_char,_std::allocator<signed_char>_> *)this;
  local_10 = __return_storage_ptr__;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    make_tmpfile_abi_cxx11_(&local_58,this);
    std::__cxx11::string::operator=((string *)filename,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var1 = std::operator|(_S_out,_S_bin);
  std::fstream::fstream(local_268,pcVar3,_Var1);
  top_level_array_sender<std::vector<signed_char,std::allocator<signed_char>>,gnuplotio::Mode1D,gnuplotio::ModeBinary>
            (local_258,filename_local);
  std::fstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
  poVar4 = std::operator<<((ostream *)local_3f8," \'");
  poVar4 = std::operator<<(poVar4,(string *)filename);
  poVar4 = std::operator<<(poVar4,"\' binary");
  binfmt<std::vector<signed_char,std::allocator<signed_char>>,gnuplotio::Mode1D>
            (local_418,this,filename_local,local_38);
  std::operator<<(poVar4,local_418);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::fstream::~fstream(local_268);
  return __return_storage_ptr__;
}

Assistant:

std::string binaryFile(const T &arg, std::string filename, const std::string &arr_or_rec, OrganizationMode) {
        if(filename.empty()) filename = make_tmpfile();
        std::fstream tmp_stream(filename.c_str(), std::fstream::out | std::fstream::binary);
        top_level_array_sender(tmp_stream, arg, OrganizationMode(), ModeBinary());
        tmp_stream.close();

        std::ostringstream cmdline;
        // FIXME - hopefully filename doesn't contain quotes or such...
        cmdline << " '" << filename << "' binary" << binfmt(arg, arr_or_rec, OrganizationMode());
        return cmdline.str();
    }